

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::DelSomeItem(Map *this,short uid,int amount,Character *from)

{
  int iVar1;
  Character *pCVar2;
  bool bVar3;
  int iVar4;
  list<Character_*,_std::allocator<Character_*>_> *plVar5;
  _List_node_base *p_Var6;
  iterator it;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  if (-1 < amount) {
    it._M_node = (_List_node_base *)&this->items;
    do {
      it._M_node = (it._M_node)->_M_next;
      if (it._M_node == (_List_node_base *)&this->items) {
        return;
      }
      p_Var6 = it._M_node[1]._M_next;
    } while (*(short *)&p_Var6->_M_next != uid);
    iVar1 = *(int *)((long)&p_Var6->_M_next + 4);
    iVar4 = iVar1 - amount;
    if (iVar4 == 0 || iVar1 < amount) {
      DelItem(this,it,from);
      return;
    }
    *(int *)((long)&p_Var6->_M_next + 4) = iVar4;
    PacketBuilder::PacketBuilder(&local_60,PACKET_ITEM,PACKET_REMOVE,2);
    PacketBuilder::AddShort(&local_60,(int)*(short *)&(it._M_node[1]._M_next)->_M_next);
    p_Var6 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    plVar5 = &this->characters;
    if (p_Var6 != (_List_node_base *)plVar5) {
      do {
        pCVar2 = (Character *)p_Var6[1]._M_next;
        if (((from == (Character *)0x0) || (pCVar2 != from)) &&
           (bVar3 = Character::InRange(pCVar2,(Map_Item *)it._M_node[1]._M_next), bVar3)) {
          Character::Send(pCVar2,&local_60);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)plVar5);
    }
    PacketBuilder::Reset(&local_60,9);
    PacketBuilder::SetID(&local_60,PACKET_ITEM,PACKET_ADD);
    PacketBuilder::AddShort(&local_60,(int)*(short *)((long)&(it._M_node[1]._M_next)->_M_next + 2));
    PacketBuilder::AddShort(&local_60,(int)*(short *)&(it._M_node[1]._M_next)->_M_next);
    PacketBuilder::AddThree(&local_60,*(int *)((long)&(it._M_node[1]._M_next)->_M_next + 4));
    PacketBuilder::AddChar(&local_60,(uint)*(byte *)&(it._M_node[1]._M_next)->_M_prev);
    PacketBuilder::AddChar(&local_60,(uint)*(byte *)((long)&(it._M_node[1]._M_next)->_M_prev + 1));
    p_Var6 = (plVar5->super__List_base<Character_*,_std::allocator<Character_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var6 != (_List_node_base *)plVar5) {
      do {
        pCVar2 = (Character *)p_Var6[1]._M_next;
        bVar3 = Character::InRange(pCVar2,(Map_Item *)it._M_node[1]._M_next);
        if (bVar3) {
          Character::Send(pCVar2,&local_60);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)plVar5);
    }
    PacketBuilder::~PacketBuilder(&local_60);
  }
  return;
}

Assistant:

void Map::DelSomeItem(short uid, int amount, Character *from)
{
	if (amount < 0)
		return;

	UTIL_IFOREACH(this->items, it)
	{
		if ((*it)->uid == uid)
		{
			if (amount < (*it)->amount)
			{
				(*it)->amount -= amount;

				PacketBuilder builder(PACKET_ITEM, PACKET_REMOVE, 2);
				builder.AddShort((*it)->uid);

				UTIL_FOREACH(this->characters, character)
				{
					if ((from && character == from) || !character->InRange(**it))
					{
						continue;
					}

					character->Send(builder);
				}

				builder.Reset(9);
				builder.SetID(PACKET_ITEM, PACKET_ADD);
				builder.AddShort((*it)->id);
				builder.AddShort((*it)->uid);
				builder.AddThree((*it)->amount);
				builder.AddChar((*it)->x);
				builder.AddChar((*it)->y);

				UTIL_FOREACH(this->characters, character)
				{
					if (!character->InRange(**it))
						continue;

					character->Send(builder);
				}
			}
			else
			{
				this->DelItem(it, from);
			}

			break;
		}
	}
}